

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

bool __thiscall
glcts::TextureCubeMapArraySamplingTest::verifyResultHelper
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          resolutionDefinition *resolution,componentProvider *component_provider,uchar *data)

{
  uint uVar1;
  GLenum GVar2;
  bool bVar3;
  ulong uVar4;
  _func_void_GLuint_GLint_GLint_GLint_GLint_GLubyte_ptr *getComponents;
  GLuint n_mipmap_levels;
  
  uVar1 = resolution->m_height;
  if ((int)resolution->m_height < (int)resolution->m_width) {
    uVar1 = resolution->m_width;
  }
  n_mipmap_levels = 1;
  if (1 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
    do {
      uVar4 = uVar4 >> 1;
      n_mipmap_levels = n_mipmap_levels + 1;
      bVar3 = 3 < uVar1;
      uVar1 = (uint)uVar4;
    } while (bVar3);
  }
  uVar1 = resolution->m_depth;
  GVar2 = (format->m_source).m_format;
  if (GVar2 == 0x8d99) {
    GVar2 = (format->m_source).m_type;
    if (GVar2 == 0x1404) {
      bVar3 = verifyResultImage<int,4u,3u,3u>
                        (n_mipmap_levels,uVar1 / 6,
                         (_func_void_GLuint_GLint_GLint_GLint_GLint_int_ptr *)
                         component_provider->getColorIntComponents,data);
      goto LAB_00d7dbaf;
    }
    if (GVar2 == 0x1405) {
      bVar3 = verifyResultImage<unsigned_int,4u,3u,3u>
                        (n_mipmap_levels,uVar1 / 6,
                         (_func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *)
                         component_provider->getColorUintComponents,data);
      goto LAB_00d7dbaf;
    }
  }
  else if (GVar2 == 0x1908) {
    GVar2 = (format->m_source).m_type;
    if (GVar2 == 0x9278) {
      getComponents = component_provider->getCompressedComponents;
    }
    else {
      if (GVar2 == 0x1406) {
        bVar3 = verifyResultImage<float,4u,3u,3u>
                          (n_mipmap_levels,uVar1 / 6,
                           (_func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *)
                           component_provider->getColorFloatComponents,data);
        goto LAB_00d7dbaf;
      }
      if (GVar2 != 0x1401) goto LAB_00d7db75;
      getComponents = component_provider->getColorUByteComponents;
    }
    bVar3 = verifyResultImage<unsigned_char,4u,3u,3u>
                      (n_mipmap_levels,uVar1 / 6,
                       (_func_void_GLuint_GLint_GLint_GLint_GLint_uchar_ptr *)getComponents,data);
    goto LAB_00d7dbaf;
  }
LAB_00d7db75:
  bVar3 = false;
LAB_00d7dbaf:
  if (((format->m_source).m_format == 0x1902) && ((format->m_source).m_type == 0x1406)) {
    bVar3 = verifyResultImage<float,1u,3u,3u>
                      (n_mipmap_levels,uVar1 / 6,
                       (_func_void_GLuint_GLint_GLint_GLint_GLint_float_ptr *)
                       component_provider->getDepthComponents,data);
  }
  if (((format->m_source).m_format == 0x1901) && ((format->m_source).m_type == 0x1401)) {
    bVar3 = verifyResultImage<unsigned_int,1u,3u,3u>
                      (n_mipmap_levels,uVar1 / 6,
                       (_func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *)
                       component_provider->getStencilComponents,data);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool TextureCubeMapArraySamplingTest::verifyResultHelper(const formatDefinition&	 format,
														 const resolutionDefinition& resolution,
														 const componentProvider&	component_provider,
														 unsigned char*				 data)
{
	const glw::GLuint n_mipmap_levels = getMipmapLevelCount(resolution.m_width, resolution.m_height);
	const glw::GLuint n_layers		  = resolution.m_depth / 6;

	bool result = false;

	if (GL_RGBA == format.m_source.m_format)
	{
		if (GL_UNSIGNED_BYTE == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLubyte, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getColorUByteComponents, data);
		}
		else if (GL_FLOAT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLfloat, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getColorFloatComponents, data);
		}
		else if (GL_COMPRESSED_RGBA8_ETC2_EAC == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLubyte, 4, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getCompressedComponents, data);
		}
	}
	else if (GL_RGBA_INTEGER == format.m_source.m_format)
	{
		if (GL_UNSIGNED_INT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLuint, 4, 3, 3>(n_mipmap_levels, n_layers,
															 component_provider.getColorUintComponents, data);
		}
		else if (GL_INT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLint, 4, 3, 3>(n_mipmap_levels, n_layers,
															component_provider.getColorIntComponents, data);
		}
	}
	if (GL_DEPTH_COMPONENT == format.m_source.m_format)
	{
		if (GL_FLOAT == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLfloat, 1, 3, 3>(n_mipmap_levels, n_layers,
															  component_provider.getDepthComponents, data);
		}
	}
	if (GL_STENCIL_INDEX == format.m_source.m_format)
	{
		if (GL_UNSIGNED_BYTE == format.m_source.m_type)
		{
			result = verifyResultImage<glw::GLuint, 1, 3, 3>(n_mipmap_levels, n_layers,
															 component_provider.getStencilComponents, data);
		}
	}

	return result;
}